

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O2

void * ngx_hash_find(ngx_hash_t *hash,ngx_uint_t key,u_char *name,size_t len)

{
  u_char *puVar1;
  u_char *puVar2;
  ngx_hash_elt_t *pnVar3;
  size_t sVar4;
  
  pnVar3 = hash->buckets[key % hash->size];
  if (pnVar3 != (ngx_hash_elt_t *)0x0) {
    for (; pnVar3->value != (void *)0x0;
        pnVar3 = (ngx_hash_elt_t *)
                 ((ulong)(pnVar3[1].name + ((ulong)pnVar3->len - 9)) & 0xfffffffffffffff8)) {
      if (pnVar3->len == len) {
        sVar4 = 0;
        do {
          if (len == sVar4) {
            return pnVar3->value;
          }
          puVar1 = name + sVar4;
          puVar2 = pnVar3->name + sVar4;
          sVar4 = sVar4 + 1;
        } while (*puVar1 == *puVar2);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
ngx_hash_find(ngx_hash_t *hash, ngx_uint_t key, u_char *name, size_t len)
{
    ngx_uint_t       i;
    ngx_hash_elt_t  *elt;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "hf:\"%*s\"", len, name);
#endif

    elt = hash->buckets[key % hash->size];

    if (elt == NULL) {
        return NULL;
    }

    while (elt->value) {
        if (len != (size_t) elt->len) {
            goto next;
        }

        for (i = 0; i < len; i++) {
            if (name[i] != elt->name[i]) {
                goto next;
            }
        }

        return elt->value;

    next:

        elt = (ngx_hash_elt_t *) ngx_align_ptr(&elt->name[0] + elt->len,
                                               sizeof(void *));
        continue;
    }

    return NULL;
}